

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

bam_hdr_t * bam_hdr_read(BGZF *fp)

{
  int iVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  bam_hdr_t *data;
  char *data_00;
  char **ppcVar3;
  uint32_t *puVar4;
  void *pvVar5;
  uint uVar6;
  uint32_t uVar7;
  long lVar8;
  ulong uVar9;
  int32_t name_len;
  char buf [4];
  
  _name_len = in_RAX;
  iVar1 = bgzf_check_EOF(fp);
  if (iVar1 < 0) {
    perror("[W::sam_hdr_read] bgzf_check_EOF");
  }
  else if ((iVar1 == 0) && (1 < hts_verbose)) {
    fprintf(_stderr,"[W::%s] EOF marker is absent. The input is probably truncated.\n",
            "bam_hdr_read");
  }
  sVar2 = bgzf_read(fp,buf,4);
  if (((int)sVar2 == 4) && (buf == (char  [4])0x14d4142)) {
    data = bam_hdr_init();
    puVar4 = &data->l_text;
    bgzf_read(fp,puVar4,4);
    if ((fp->field_0x2 & 0xc) == 0) {
      uVar7 = *puVar4;
    }
    else {
      uVar6 = *puVar4;
      uVar7 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      *puVar4 = uVar7;
    }
    data_00 = (char *)malloc((ulong)(uVar7 + 1));
    data->text = data_00;
    data_00[uVar7] = '\0';
    bgzf_read(fp,data_00,(ulong)uVar7);
    bgzf_read(fp,data,4);
    if ((fp->field_0x2 & 0xc) == 0) {
      uVar6 = data->n_targets;
    }
    else {
      uVar6 = data->n_targets;
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      data->n_targets = uVar6;
    }
    ppcVar3 = (char **)calloc((long)(int)uVar6,8);
    data->target_name = ppcVar3;
    puVar4 = (uint32_t *)calloc((long)(int)uVar6,4);
    data->target_len = puVar4;
    lVar8 = 0;
    for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
      bgzf_read(fp,&name_len,4);
      uVar6 = name_len;
      if ((fp->field_0x2 & 0xc) != 0) {
        uVar6 = (uint)name_len >> 0x18 | (name_len & 0xff0000U) >> 8 | (name_len & 0xff00U) << 8 |
                name_len << 0x18;
        _name_len = CONCAT44(buf,uVar6);
      }
      pvVar5 = calloc((long)(int)uVar6,1);
      *(void **)((long)data->target_name + lVar8 * 2) = pvVar5;
      bgzf_read(fp,*(void **)((long)data->target_name + lVar8 * 2),(long)(int)uVar6);
      bgzf_read(fp,(void *)((long)data->target_len + lVar8),4);
      if ((fp->field_0x2 & 0xc) != 0) {
        uVar6 = *(uint *)((long)data->target_len + lVar8);
        *(uint *)((long)data->target_len + lVar8) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      }
      uVar6 = data->n_targets;
      lVar8 = lVar8 + 4;
    }
  }
  else if (hts_verbose < 1) {
    data = (bam_hdr_t *)0x0;
  }
  else {
    data = (bam_hdr_t *)0x0;
    fprintf(_stderr,"[E::%s] invalid BAM binary header\n","bam_hdr_read");
  }
  return data;
}

Assistant:

bam_hdr_t *bam_hdr_read(BGZF *fp)
{
    bam_hdr_t *h;
    char buf[4];
    int magic_len, has_EOF;
    int32_t i = 1, name_len;
    // check EOF
    has_EOF = bgzf_check_EOF(fp);
    if (has_EOF < 0) {
        perror("[W::sam_hdr_read] bgzf_check_EOF");
    } else if (has_EOF == 0 && hts_verbose >= 2)
        fprintf(stderr, "[W::%s] EOF marker is absent. The input is probably truncated.\n", __func__);
    // read "BAM1"
    magic_len = bgzf_read(fp, buf, 4);
    if (magic_len != 4 || strncmp(buf, "BAM\1", 4)) {
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] invalid BAM binary header\n", __func__);
        return 0;
    }
    h = bam_hdr_init();
    // read plain text and the number of reference sequences
    bgzf_read(fp, &h->l_text, 4);
    if (fp->is_be) ed_swap_4p(&h->l_text);
    h->text = (char*)malloc(h->l_text + 1);
    h->text[h->l_text] = 0; // make sure it is NULL terminated
    bgzf_read(fp, h->text, h->l_text);
    bgzf_read(fp, &h->n_targets, 4);
    if (fp->is_be) ed_swap_4p(&h->n_targets);
    // read reference sequence names and lengths
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    for (i = 0; i != h->n_targets; ++i) {
        bgzf_read(fp, &name_len, 4);
        if (fp->is_be) ed_swap_4p(&name_len);
        h->target_name[i] = (char*)calloc(name_len, 1);
        bgzf_read(fp, h->target_name[i], name_len);
        bgzf_read(fp, &h->target_len[i], 4);
        if (fp->is_be) ed_swap_4p(&h->target_len[i]);
    }
    return h;
}